

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O1

int PUSH_NEXT(xmlNodePtr *dst,size_t size,TEMP_STORAGE_T *store,size_t minrun,
             TIM_SORT_RUN_T *run_stack,size_t *stack_curr,size_t *curr)

{
  xmlNodePtr node2;
  xmlNodePtr pxVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar6 = *curr;
  uVar4 = size - uVar6;
  uVar7 = 1;
  if (uVar4 != 1) {
    if (uVar6 < size - 2) {
      lVar8 = uVar6 + 2;
      iVar3 = xmlXPathCmpNodesExt(dst[uVar6],dst[uVar6 + 1]);
      if (iVar3 < 0 && iVar3 != -2) {
        if (lVar8 != size - 1) {
          uVar7 = uVar6;
          do {
            iVar3 = xmlXPathCmpNodesExt(dst[uVar7 + 1],dst[uVar7 + 2]);
            if ((iVar3 == -2) || (-1 < iVar3)) break;
            uVar7 = uVar7 + 1;
          } while (size - 3 != uVar7);
          lVar8 = uVar7 + 2;
        }
        if (uVar6 < lVar8 - 1U) {
          uVar7 = lVar8 - 2;
          uVar5 = uVar6;
          do {
            pxVar1 = dst[uVar5];
            dst[uVar5] = dst[uVar7 + 1];
            dst[uVar7 + 1] = pxVar1;
            uVar5 = uVar5 + 1;
            bVar9 = uVar5 < uVar7;
            uVar7 = uVar7 - 1;
          } while (bVar9);
        }
      }
      else if (lVar8 != size - 1) {
        uVar7 = uVar6;
        do {
          iVar3 = xmlXPathCmpNodesExt(dst[uVar7 + 1],dst[uVar7 + 2]);
          if (iVar3 != -2 && iVar3 < 0) break;
          uVar7 = uVar7 + 1;
        } while (size - 3 != uVar7);
        lVar8 = uVar7 + 2;
      }
      uVar7 = lVar8 - uVar6;
    }
    else {
      pxVar1 = dst[size - 2];
      node2 = dst[size - 1];
      iVar3 = xmlXPathCmpNodesExt(pxVar1,node2);
      uVar7 = 2;
      if (iVar3 < 0 && iVar3 != -2) {
        dst[size - 2] = node2;
        dst[size - 1] = pxVar1;
      }
    }
  }
  if (uVar4 < minrun) {
    minrun = uVar4;
  }
  if (uVar7 < minrun) {
    libxml_domnode_binary_insertion_sort_start(dst + uVar6,uVar7,minrun);
    uVar7 = minrun;
  }
  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = uVar7;
  *stack_curr = *stack_curr + 1;
  sVar2 = *curr;
  *curr = uVar7 + sVar2;
  iVar3 = 1;
  if (uVar7 + sVar2 == size) {
    uVar6 = *stack_curr;
    while (1 < uVar6) {
      libxml_domnode_tim_sort_merge(dst,run_stack,(int)uVar6,store);
      run_stack[*stack_curr - 2].length =
           run_stack[*stack_curr - 2].length + run_stack[*stack_curr - 1].length;
      uVar6 = *stack_curr - 1;
      *stack_curr = uVar6;
    }
    iVar3 = 0;
    if (store->storage != (xmlNodePtr *)0x0) {
      free(store->storage);
      store->storage = (xmlNodePtr *)0x0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static __inline int PUSH_NEXT(SORT_TYPE *dst,
                              const size_t size,
                              TEMP_STORAGE_T *store,
                              const size_t minrun,
                              TIM_SORT_RUN_T *run_stack,
                              size_t *stack_curr,
                              size_t *curr) {
  size_t len = COUNT_RUN(dst, *curr, size);
  size_t run = minrun;

  if (run > size - *curr) {
    run = size - *curr;
  }

  if (run > len) {
    BINARY_INSERTION_SORT_START(&dst[*curr], len, run);
    len = run;
  }

  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = len;
  (*stack_curr)++;
  *curr += len;

  if (*curr == size) {
    /* finish up */
    while (*stack_curr > 1) {
      TIM_SORT_MERGE(dst, run_stack, *stack_curr, store);
      run_stack[*stack_curr - 2].length += run_stack[*stack_curr - 1].length;
      (*stack_curr)--;
    }

    if (store->storage != NULL) {
      free(store->storage);
      store->storage = NULL;
    }

    return 0;
  }

  return 1;
}